

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O1

String * Rml::StringUtilities::DecodeRml(String *__return_storage_ptr__,String *s)

{
  byte bVar1;
  pointer pcVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  char *end;
  String tmp;
  undefined4 local_84;
  String local_80;
  char *local_60;
  long *local_58 [2];
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (s->_M_string_length != 0) {
    pcVar7 = (char *)0x0;
    do {
      pcVar2 = (s->_M_dataplus)._M_p;
      if (pcVar7[(long)pcVar2] != '&') goto LAB_00267c3b;
      bVar1 = pcVar7[(long)(pcVar2 + 1)];
      if (bVar1 < 0x67) {
        if (bVar1 == 0x23) {
          if (pcVar7[(long)(pcVar2 + 2)] == 'x') {
            lVar5 = 0;
            do {
              if ((9 < (byte)(pcVar7[(long)(pcVar2 + lVar5 + 3)] - 0x30U)) &&
                 ((uVar6 = (byte)pcVar7[(long)(pcVar2 + lVar5 + 3)] - 0x41, 0x25 < uVar6 ||
                  ((0x3f0000003fU >> ((ulong)uVar6 & 0x3f) & 1) == 0)))) goto LAB_00267aa5;
              lVar5 = lVar5 + 1;
            } while (lVar5 != 8);
            lVar5 = 8;
LAB_00267aa5:
            bVar8 = true;
            if ((lVar5 != 0) && (pcVar7[(long)(pcVar2 + lVar5 + 3)] == ';')) {
              ::std::__cxx11::string::substr((ulong)local_58,(ulong)s);
              plVar3 = local_58[0];
              uVar4 = strtoul((char *)local_58[0],&local_60,0x10);
              bVar8 = uVar4 + 1 < 2;
              if (!bVar8) {
                local_84 = (undefined4)uVar4;
                ToUTF8_abi_cxx11_(&local_80,(StringUtilities *)&local_84,(Character *)0x1,
                                  (int)(uVar4 + 1));
                ::std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._M_dataplus._M_p != &local_80.field_2) {
                  operator_delete(local_80._M_dataplus._M_p,
                                  local_80.field_2._M_allocated_capacity + 1);
                }
                pcVar7 = local_60 + (long)(pcVar7 + (4 - (long)plVar3));
              }
LAB_00267c10:
              if (local_58[0] != local_48) {
                operator_delete(local_58[0],local_48[0] + 1);
              }
            }
          }
          else {
            lVar5 = 0;
            do {
              if (9 < (byte)(pcVar7[(long)(pcVar2 + lVar5 + 2)] - 0x30U)) goto LAB_00267b73;
              lVar5 = lVar5 + 1;
            } while (lVar5 != 8);
            lVar5 = 8;
LAB_00267b73:
            bVar8 = true;
            if ((lVar5 != 0) && (pcVar7[(long)(pcVar2 + lVar5 + 2)] == ';')) {
              ::std::__cxx11::string::substr((ulong)local_58,(ulong)s);
              plVar3 = local_58[0];
              uVar4 = strtoul((char *)local_58[0],&local_60,10);
              bVar8 = uVar4 + 1 < 2;
              if (!bVar8) {
                local_84 = (undefined4)uVar4;
                ToUTF8_abi_cxx11_(&local_80,(StringUtilities *)&local_84,(Character *)0x1,
                                  (int)(uVar4 + 1));
                ::std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._M_dataplus._M_p != &local_80.field_2) {
                  operator_delete(local_80._M_dataplus._M_p,
                                  local_80.field_2._M_allocated_capacity + 1);
                }
                pcVar7 = local_60 + (long)(pcVar7 + (3 - (long)plVar3));
              }
              goto LAB_00267c10;
            }
          }
          if (bVar8) goto LAB_00267c3b;
        }
        else {
LAB_002679d5:
          if ((bVar1 != 0x61) ||
             (((pcVar7[(long)(pcVar2 + 2)] != 'm' || (pcVar7[(long)(pcVar2 + 3)] != 'p')) ||
              (pcVar7[(long)(pcVar2 + 4)] != ';')))) goto LAB_00267c3b;
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          pcVar7 = pcVar7 + 5;
        }
      }
      else if (bVar1 == 0x67) {
        if ((pcVar7[(long)(pcVar2 + 2)] != 't') || (pcVar7[(long)(pcVar2 + 3)] != ';'))
        goto LAB_002679d5;
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_002679be:
        pcVar7 = pcVar7 + 4;
      }
      else {
        if (bVar1 == 0x71) {
          if (((pcVar7[(long)(pcVar2 + 2)] == 'u') && (pcVar7[(long)(pcVar2 + 3)] == 'o')) &&
             ((pcVar7[(long)(pcVar2 + 4)] == 't' && (pcVar7[(long)(pcVar2 + 5)] == ';')))) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            pcVar7 = pcVar7 + 6;
            goto LAB_00267c4e;
          }
        }
        else if (((bVar1 == 0x6c) && (pcVar7[(long)(pcVar2 + 2)] == 't')) &&
                (pcVar7[(long)(pcVar2 + 3)] == ';')) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          goto LAB_002679be;
        }
LAB_00267c3b:
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
        pcVar7 = pcVar7 + 1;
      }
LAB_00267c4e:
    } while (pcVar7 < (char *)s->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

String StringUtilities::DecodeRml(const String& s)
{
	String result;
	result.reserve(s.size());
	for (size_t i = 0; i < s.size();)
	{
		if (s[i] == '&')
		{
			if (s[i + 1] == 'l' && s[i + 2] == 't' && s[i + 3] == ';')
			{
				result += "<";
				i += 4;
				continue;
			}
			else if (s[i + 1] == 'g' && s[i + 2] == 't' && s[i + 3] == ';')
			{
				result += ">";
				i += 4;
				continue;
			}
			else if (s[i + 1] == 'a' && s[i + 2] == 'm' && s[i + 3] == 'p' && s[i + 4] == ';')
			{
				result += "&";
				i += 5;
				continue;
			}
			else if (s[i + 1] == 'q' && s[i + 2] == 'u' && s[i + 3] == 'o' && s[i + 4] == 't' && s[i + 5] == ';')
			{
				result += "\"";
				i += 6;
				continue;
			}
			else if (s[i + 1] == '#')
			{
				size_t start = i + 2;
				if (s[i + 2] == 'x')
				{
					start++;
					size_t j = 0;
					for (; j < 8; j++)
					{
						const auto& c = s[start + j];
						if (!((c >= '0' && c <= '9') || (c >= 'a' && c <= 'f') || (c >= 'A' && c <= 'F')))
							break;
					}

					if (j > 0 && s[start + j] == ';')
					{
						String tmp = s.substr(start, j);
						const char* begin = tmp.c_str();
						char* end;
						unsigned long code_point = strtoul(begin, &end, 16);
						if (code_point != 0 && code_point != ULONG_MAX)
						{
							result += ToUTF8(static_cast<Character>(code_point));
							i = start + (end - begin) + 1;
							continue;
						}
					}
				}
				else
				{
					size_t j = 0;
					for (; j < 8; j++)
					{
						const auto& c = s[start + j];
						if (!(c >= '0' && c <= '9'))
							break;
					}

					if (j > 0 && s[start + j] == ';')
					{
						String tmp = s.substr(start, j);
						const char* begin = tmp.c_str();
						char* end;
						unsigned long code_point = strtoul(begin, &end, 10);
						if (code_point != 0 && code_point != ULONG_MAX)
						{
							result += ToUTF8(static_cast<Character>(code_point));
							i = start + (end - begin) + 1;
							continue;
						}
					}
				}
			}
		}
		result += s[i];
		i += 1;
	}
	return result;
}